

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

int32_t mipsdsp_sat32_acc_q31(int32_t acc,int32_t a,CPUMIPSState_conflict5 *env)

{
  ulong uVar1;
  int64_t temp_sum;
  int32_t result;
  int32_t temp31;
  int32_t temp32;
  int64_t temp;
  CPUMIPSState_conflict5 *env_local;
  int32_t a_local;
  int32_t acc_local;
  
  uVar1 = (long)a + (env->active_tc).LO[acc];
  temp_sum._4_4_ = (int32_t)uVar1;
  if (((uint)(uVar1 >> 0x20) & 1) != ((uint)((long)uVar1 >> 0x1f) & 1)) {
    if ((uVar1 & 0x100000000) == 0) {
      temp_sum._4_4_ = 0x7fffffff;
    }
    else {
      temp_sum._4_4_ = -0x80000000;
    }
    set_DSPControl_overflow_flag(1,acc + 0x10,env);
  }
  return temp_sum._4_4_;
}

Assistant:

static inline int32_t mipsdsp_sat32_acc_q31(int32_t acc, int32_t a,
                                            CPUMIPSState *env)
{
    int64_t temp;
    int32_t temp32, temp31, result;
    int64_t temp_sum;

#ifndef TARGET_MIPS64
    temp = ((uint64_t)env->active_tc.HI[acc] << 32) |
           (uint64_t)env->active_tc.LO[acc];
#else
    temp = (uint64_t)env->active_tc.LO[acc];
#endif

    temp_sum = (int64_t)a + temp;

    temp32 = (temp_sum >> 32) & 0x01;
    temp31 = (temp_sum >> 31) & 0x01;
    result = temp_sum & 0xFFFFFFFF;

    if (temp32 != temp31) {
        if (temp32 == 0) {
            result = 0x7FFFFFFF;
        } else {
            result = 0x80000000;
        }
        set_DSPControl_overflow_flag(1, 16 + acc, env);
    }

    return result;
}